

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::GetRTCPSourceData
          (RTPSources *this,uint32_t ssrc,RTPAddress *senderaddress,RTPInternalSourceData **srcdat2,
          bool *newsource)

{
  bool bVar1;
  int iVar2;
  bool created;
  RTPInternalSourceData *srcdat;
  bool local_41;
  bool *local_40;
  RTPInternalSourceData *local_38;
  
  *srcdat2 = (RTPInternalSourceData *)0x0;
  iVar2 = ObtainSourceDataInstance(this,ssrc,&local_38,&local_41);
  if (-1 < iVar2) {
    local_40 = newsource;
    if (local_41 == true) {
      iVar2 = RTPInternalSourceData::SetRTCPDataAddress(local_38,senderaddress);
      if (iVar2 < 0) {
        return iVar2;
      }
    }
    else {
      bVar1 = CheckCollision(this,local_38,senderaddress,false);
      if (bVar1) {
        return 0;
      }
    }
    *srcdat2 = local_38;
    *local_40 = local_41;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int RTPSources::GetRTCPSourceData(uint32_t ssrc,const RTPAddress *senderaddress,
		                  RTPInternalSourceData **srcdat2,bool *newsource)
{
	int status;
	bool created;
	RTPInternalSourceData *srcdat;
	
	*srcdat2 = 0;
	
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;
	
	if (created)
	{
		if ((status = srcdat->SetRTCPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,false))
			return 0; // ignore packet on collision
	}
	
	*srcdat2 = srcdat;
	*newsource = created;

	return 0;
}